

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O3

int sam_hdr_update(SAM_hdr *hdr,SAM_hdr_type *type,...)

{
  void *pvVar1;
  SAM_hdr_tag *pSVar2;
  size_t sVar3;
  char in_AL;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  SAM_hdr_tag *pSVar7;
  char *pcVar8;
  undefined8 in_RCX;
  void **ppvVar9;
  undefined8 in_RDX;
  int iVar10;
  undefined8 in_R8;
  undefined8 in_R9;
  SAM_hdr_tag *pSVar11;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  void **local_100;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_100 = &ap[0].overflow_arg_area;
  uVar4 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  do {
    uVar6 = (ulong)uVar4;
    if (uVar6 < 0x29) {
      ppvVar9 = (void **)((long)local_e8 + uVar6);
      uVar4 = uVar4 + 8;
      uVar6 = (ulong)uVar4;
    }
    else {
      ppvVar9 = local_100;
      local_100 = local_100 + 1;
    }
    pcVar8 = (char *)*ppvVar9;
    if (pcVar8 == (char *)0x0) {
      return 0;
    }
    if ((uint)uVar6 < 0x29) {
      uVar4 = (uint)uVar6 + 8;
      ppvVar9 = (void **)((long)local_e8 + uVar6);
    }
    else {
      ppvVar9 = local_100;
      local_100 = local_100 + 1;
    }
    pvVar1 = *ppvVar9;
    pSVar2 = type->tag;
    if (pSVar2 == (SAM_hdr_tag *)0x0) {
      pSVar11 = (SAM_hdr_tag *)0x0;
    }
    else {
      do {
        pSVar7 = pSVar2;
        if ((*pSVar7->str == *pcVar8) && (pSVar7->str[1] == pcVar8[1])) goto LAB_00138f4d;
        pSVar2 = pSVar7->next;
        pSVar11 = pSVar7;
      } while (pSVar7->next != (SAM_hdr_tag_s *)0x0);
    }
    pSVar7 = (SAM_hdr_tag *)pool_alloc(hdr->tag_pool);
    if (pSVar7 == (SAM_hdr_tag *)0x0) {
      return -1;
    }
    if (pSVar11 == (SAM_hdr_tag *)0x0) {
      pSVar11 = (SAM_hdr_tag *)&type->tag;
    }
    pSVar11->next = pSVar7;
    pSVar7->next = (SAM_hdr_tag_s *)0x0;
LAB_00138f4d:
    sVar3 = (hdr->text).l;
    iVar5 = ksprintf(&hdr->text,"%2.2s:%s",pcVar8,pvVar1);
    if (iVar5 < 0) {
      return -1;
    }
    iVar10 = (int)sVar3;
    iVar5 = (int)(hdr->text).l - iVar10;
    pSVar7->len = iVar5;
    pcVar8 = string_ndup(hdr->str_pool,(hdr->text).s + iVar10,(long)iVar5);
    pSVar7->str = pcVar8;
    if (pcVar8 == (char *)0x0) {
      return -1;
    }
  } while( true );
}

Assistant:

int sam_hdr_update(SAM_hdr *hdr, SAM_hdr_type *type, ...) {
    va_list ap;

    va_start(ap, type);
    
    for (;;) {
	char *k, *v;
	int idx;
	SAM_hdr_tag *tag, *prev;

	if (!(k = (char *)va_arg(ap, char *)))
	    break;
	v = va_arg(ap, char *);

	tag = sam_hdr_find_key(hdr, type, k, &prev);
	if (!tag) {
	    if (!(tag = pool_alloc(hdr->tag_pool)))
		return -1;
	    if (prev)
		prev->next = tag;
	    else
		type->tag = tag;

	    tag->next = NULL;
	}

	idx = ks_len(&hdr->text);
	if (ksprintf(&hdr->text, "%2.2s:%s", k, v) < 0)
	    return -1;
	tag->len = ks_len(&hdr->text) - idx;
	tag->str = string_ndup(hdr->str_pool,
			       ks_str(&hdr->text) + idx,
			       tag->len);
	if (!tag->str)
	    return -1;
    }

    va_end(ap);

    return 0;
}